

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Warfare_Header::operator==(Warfare_Header *this,Warfare_Header *Value)

{
  KBOOL KVar1;
  Warfare_Header *Value_local;
  Warfare_Header *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                      (&this->m_FiringEntityID,&Value->m_FiringEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                        (&this->m_TargetEntityID,&Value->m_TargetEntityID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_MunitionID,&Value->m_MunitionID);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Warfare_Header::operator == ( const Warfare_Header & Value ) const
{
    if( Header::operator !=( Value ) )               return false;
    if( m_FiringEntityID != Value.m_FiringEntityID ) return false;
    if( m_TargetEntityID != Value.m_TargetEntityID ) return false;
    if( m_MunitionID     != Value.m_MunitionID )     return false;
    if( m_EventID        != Value.m_EventID )        return false;
    return true;
}